

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall r_code::list<r_exec::CInput>::push_back(list<r_exec::CInput> *this,CInput *t)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  
  if (this->free_cell_count == 0) {
    push_back_new_cell(this,t);
  }
  else {
    push_back_free_cell(this,t);
  }
  pcVar1 = (this->cells).
           super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = this->used_cells_tail;
  lVar3 = pcVar1[lVar2].prev;
  if (lVar3 != -1) {
    pcVar1[lVar3].next = lVar2;
  }
  if (this->used_cells_head == -1) {
    this->used_cells_head = lVar2;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_back(const T &t)
    {
        if (free_cell_count) {
            push_back_free_cell(t);
        } else {
            push_back_new_cell(t);
        }

        update_used_cells_tail_state();
    }